

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void av1_inv_txfm_add_ssse3(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  undefined1 *puVar9;
  undefined1 auStack_2060 [8240];
  
  if (txfm_param->lossless == 0) {
    av1_lowbd_inv_txfm2d_add_ssse3
              (dqcoeff,dst,stride,txfm_param->tx_type,txfm_param->tx_size,txfm_param->eob);
    return;
  }
  puVar4 = auStack_2060;
  puVar9 = auStack_2060;
  uVar2 = tx_size_wide[txfm_param->tx_size];
  if (tx_size_wide[txfm_param->tx_size] < 2) {
    uVar2 = 1;
  }
  uVar1 = tx_size_high[txfm_param->tx_size];
  uVar3 = 1;
  if (1 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar6 = 0;
  puVar7 = dst;
  do {
    uVar8 = 0;
    do {
      *(ushort *)(puVar4 + uVar8 * 2) = (ushort)puVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
    uVar6 = uVar6 + 1;
    puVar7 = puVar7 + stride;
    puVar4 = puVar4 + 0x80;
  } while (uVar6 != uVar3);
  (*av1_highbd_inv_txfm_add)(dqcoeff,(uint8_t *)((ulong)auStack_2060 >> 1),0x40,txfm_param);
  uVar6 = 1;
  if (1 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar8 = 0;
  do {
    uVar5 = 0;
    do {
      dst[uVar5] = puVar9[uVar5 * 2];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    uVar8 = uVar8 + 1;
    dst = dst + stride;
    puVar9 = puVar9 + 0x80;
  } while (uVar8 != uVar6);
  return;
}

Assistant:

void av1_inv_txfm_add_ssse3(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                            const TxfmParam *txfm_param) {
  if (!txfm_param->lossless) {
    const TX_TYPE tx_type = txfm_param->tx_type;
    av1_lowbd_inv_txfm2d_add_ssse3(dqcoeff, dst, stride, tx_type,
                                   txfm_param->tx_size, txfm_param->eob);

  } else {
    av1_inv_txfm_add_c(dqcoeff, dst, stride, txfm_param);
  }
}